

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::DebugNodeWindow(ImGuiWindow *window,char *label)

{
  ImVec2 *pIVar1;
  float *pfVar2;
  float fVar3;
  float fVar4;
  uint uVar5;
  ImGuiWindow *pIVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  ImVec2 in_RAX;
  char *pcVar10;
  char *pcVar11;
  ulong uVar12;
  char *pcVar13;
  char *pcVar14;
  char *pcVar15;
  char *pcVar16;
  char *pcVar17;
  char *pcVar18;
  long lVar19;
  char *pcVar20;
  long lVar21;
  ImVec2 local_38;
  
  if (window != (ImGuiWindow *)0x0) {
    bVar9 = window->WasActive;
    pIVar6 = GImGui->NavWindow;
    local_38 = in_RAX;
    if (bVar9 == false) {
      PushStyleColor(0,(GImGui->Style).Colors + 1);
      pcVar13 = " *Inactive*";
    }
    else {
      pcVar13 = "";
    }
    bVar7 = TreeNodeEx(label,(uint)(pIVar6 == window),"%s \'%s\'%s",label,window->Name,pcVar13);
    if (bVar9 == false) {
      PopStyleColor(1);
    }
    bVar8 = IsItemHovered(0);
    if ((bVar8 & bVar9) == 1) {
      local_38.x = (window->Pos).x + (window->Size).x;
      local_38.y = (window->Pos).y + (window->Size).y;
      ImDrawList::AddRect(&GImGui->ForegroundDrawList,&window->Pos,&local_38,0xff00ffff,0.0,0xf,1.0)
      ;
    }
    if (bVar7) {
      if (window->MemoryCompacted == true) {
        TextDisabled("Note: some memory buffers have been compacted/freed.");
      }
      uVar5 = window->Flags;
      DebugNodeDrawList(window,window->DrawList,"DrawList");
      BulletText("Pos: (%.1f,%.1f), Size: (%.1f,%.1f), ContentSize (%.1f,%.1f)",
                 (double)(window->Pos).x,(double)(window->Pos).y,(double)(window->Size).x,
                 (double)(window->Size).y,(double)(window->ContentSize).x,
                 (double)(window->ContentSize).y);
      pcVar13 = "Child ";
      if ((uVar5 >> 0x18 & 1) == 0) {
        pcVar13 = "";
      }
      pcVar10 = "Tooltip ";
      if ((uVar5 >> 0x19 & 1) == 0) {
        pcVar10 = "";
      }
      pcVar11 = "Popup ";
      if ((uVar5 >> 0x1a & 1) == 0) {
        pcVar11 = "";
      }
      pcVar14 = "Modal ";
      if ((uVar5 >> 0x1b & 1) == 0) {
        pcVar14 = "";
      }
      pcVar15 = "ChildMenu ";
      if ((uVar5 >> 0x1c & 1) == 0) {
        pcVar15 = "";
      }
      pcVar16 = "NoSavedSettings ";
      if ((uVar5 >> 8 & 1) == 0) {
        pcVar16 = "";
      }
      pcVar20 = "NoMouseInputs";
      if ((uVar5 >> 9 & 1) == 0) {
        pcVar20 = "";
      }
      pcVar17 = "NoNavInputs";
      if ((uVar5 >> 0x12 & 1) == 0) {
        pcVar17 = "";
      }
      pcVar18 = "AlwaysAutoResize";
      if ((uVar5 & 0x40) == 0) {
        pcVar18 = "";
      }
      BulletText("Flags: 0x%08X (%s%s%s%s%s%s%s%s%s..)",(ulong)uVar5,pcVar13,pcVar10,pcVar11,pcVar14
                 ,pcVar15,pcVar16,pcVar20,pcVar17,pcVar18);
      pcVar13 = "X";
      if (window->ScrollbarX == false) {
        pcVar13 = "";
      }
      pcVar10 = "Y";
      if (window->ScrollbarY == false) {
        pcVar10 = "";
      }
      BulletText("Scroll: (%.2f/%.2f,%.2f/%.2f) Scrollbar:%s%s",(double)(window->Scroll).x,
                 (double)(window->ScrollMax).x,(double)(window->Scroll).y,
                 (double)(window->ScrollMax).y,pcVar13,pcVar10);
      if ((window->Active != false) || (uVar12 = 0xffffffff, window->WasActive != false)) {
        uVar12 = (ulong)(uint)(int)window->BeginOrderWithinContext;
      }
      BulletText("Active: %d/%d, WriteAccessed: %d, BeginOrderWithinContext: %d",
                 (ulong)window->Active,(ulong)window->WasActive,(ulong)window->WriteAccessed,uVar12)
      ;
      BulletText("Appearing: %d, Hidden: %d (CanSkip %d Cannot %d), SkipItems: %d",
                 (ulong)window->Appearing,(ulong)window->Hidden,
                 (ulong)(uint)(int)window->HiddenFramesCanSkipItems,
                 (ulong)(uint)(int)window->HiddenFramesCannotSkipItems,(ulong)window->SkipItems);
      BulletText("NavLastIds: 0x%08X,0x%08X, NavLayerActiveMask: %X",(ulong)window->NavLastIds[0],
                 (ulong)window->NavLastIds[1],(ulong)(uint)(window->DC).NavLayerActiveMask);
      if (window->NavLastChildNavWindow == (ImGuiWindow *)0x0) {
        pcVar13 = "NULL";
      }
      else {
        pcVar13 = window->NavLastChildNavWindow->Name;
      }
      BulletText("NavLastChildNavWindow: %s",pcVar13);
      fVar3 = window->NavRectRel[0].Min.x;
      pIVar1 = &window->NavRectRel[0].Max;
      if ((pIVar1->x <= fVar3 && fVar3 != pIVar1->x) ||
         (fVar4 = window->NavRectRel[0].Min.y, pfVar2 = &window->NavRectRel[0].Max.y,
         *pfVar2 <= fVar4 && fVar4 != *pfVar2)) {
        BulletText("NavRectRel[0]: <None>");
      }
      else {
        BulletText("NavRectRel[0]: (%.1f,%.1f)(%.1f,%.1f)",(double)fVar3,
                   (double)window->NavRectRel[0].Min.y,(double)window->NavRectRel[0].Max.x,
                   (double)window->NavRectRel[0].Max.y);
      }
      if (window->RootWindow != window) {
        DebugNodeWindow(window->RootWindow,"RootWindow");
      }
      if (window->ParentWindow != (ImGuiWindow *)0x0) {
        DebugNodeWindow(window->ParentWindow,"ParentWindow");
      }
      if (0 < (window->DC).ChildWindows.Size) {
        DebugNodeWindowsList(&(window->DC).ChildWindows,"ChildWindows");
      }
      if (0 < (window->ColumnsStorage).Size) {
        bVar9 = TreeNode("Columns","Columns sets (%d)");
        if (bVar9) {
          if (0 < (window->ColumnsStorage).Size) {
            lVar19 = 0;
            lVar21 = 0;
            do {
              DebugNodeColumns((ImGuiOldColumns *)
                               ((long)&((window->ColumnsStorage).Data)->ID + lVar19));
              lVar21 = lVar21 + 1;
              lVar19 = lVar19 + 0x88;
            } while (lVar21 < (window->ColumnsStorage).Size);
          }
          TreePop();
        }
      }
      DebugNodeStorage(&window->StateStorage,"Storage");
      TreePop();
    }
    return;
  }
  BulletText("%s: NULL",label);
  return;
}

Assistant:

void ImGui::DebugNodeWindow(ImGuiWindow* window, const char* label)
{
    if (window == NULL)
    {
        BulletText("%s: NULL", label);
        return;
    }

    ImGuiContext& g = *GImGui;
    const bool is_active = window->WasActive;
    ImGuiTreeNodeFlags tree_node_flags = (window == g.NavWindow) ? ImGuiTreeNodeFlags_Selected : ImGuiTreeNodeFlags_None;
    if (!is_active) { PushStyleColor(ImGuiCol_Text, GetStyleColorVec4(ImGuiCol_TextDisabled)); }
    const bool open = TreeNodeEx(label, tree_node_flags, "%s '%s'%s", label, window->Name, is_active ? "" : " *Inactive*");
    if (!is_active) { PopStyleColor(); }
    if (IsItemHovered() && is_active)
        GetForegroundDrawList(window)->AddRect(window->Pos, window->Pos + window->Size, IM_COL32(255, 255, 0, 255));
    if (!open)
        return;

    if (window->MemoryCompacted)
        TextDisabled("Note: some memory buffers have been compacted/freed.");

    ImGuiWindowFlags flags = window->Flags;
    DebugNodeDrawList(window, window->DrawList, "DrawList");
    BulletText("Pos: (%.1f,%.1f), Size: (%.1f,%.1f), ContentSize (%.1f,%.1f)", window->Pos.x, window->Pos.y, window->Size.x, window->Size.y, window->ContentSize.x, window->ContentSize.y);
    BulletText("Flags: 0x%08X (%s%s%s%s%s%s%s%s%s..)", flags,
        (flags & ImGuiWindowFlags_ChildWindow)  ? "Child " : "",      (flags & ImGuiWindowFlags_Tooltip)     ? "Tooltip "   : "",  (flags & ImGuiWindowFlags_Popup) ? "Popup " : "",
        (flags & ImGuiWindowFlags_Modal)        ? "Modal " : "",      (flags & ImGuiWindowFlags_ChildMenu)   ? "ChildMenu " : "",  (flags & ImGuiWindowFlags_NoSavedSettings) ? "NoSavedSettings " : "",
        (flags & ImGuiWindowFlags_NoMouseInputs)? "NoMouseInputs":"", (flags & ImGuiWindowFlags_NoNavInputs) ? "NoNavInputs" : "", (flags & ImGuiWindowFlags_AlwaysAutoResize) ? "AlwaysAutoResize" : "");
    BulletText("Scroll: (%.2f/%.2f,%.2f/%.2f) Scrollbar:%s%s", window->Scroll.x, window->ScrollMax.x, window->Scroll.y, window->ScrollMax.y, window->ScrollbarX ? "X" : "", window->ScrollbarY ? "Y" : "");
    BulletText("Active: %d/%d, WriteAccessed: %d, BeginOrderWithinContext: %d", window->Active, window->WasActive, window->WriteAccessed, (window->Active || window->WasActive) ? window->BeginOrderWithinContext : -1);
    BulletText("Appearing: %d, Hidden: %d (CanSkip %d Cannot %d), SkipItems: %d", window->Appearing, window->Hidden, window->HiddenFramesCanSkipItems, window->HiddenFramesCannotSkipItems, window->SkipItems);
    BulletText("NavLastIds: 0x%08X,0x%08X, NavLayerActiveMask: %X", window->NavLastIds[0], window->NavLastIds[1], window->DC.NavLayerActiveMask);
    BulletText("NavLastChildNavWindow: %s", window->NavLastChildNavWindow ? window->NavLastChildNavWindow->Name : "NULL");
    if (!window->NavRectRel[0].IsInverted())
        BulletText("NavRectRel[0]: (%.1f,%.1f)(%.1f,%.1f)", window->NavRectRel[0].Min.x, window->NavRectRel[0].Min.y, window->NavRectRel[0].Max.x, window->NavRectRel[0].Max.y);
    else
        BulletText("NavRectRel[0]: <None>");
    if (window->RootWindow != window)       { DebugNodeWindow(window->RootWindow, "RootWindow"); }
    if (window->ParentWindow != NULL)       { DebugNodeWindow(window->ParentWindow, "ParentWindow"); }
    if (window->DC.ChildWindows.Size > 0)   { DebugNodeWindowsList(&window->DC.ChildWindows, "ChildWindows"); }
    if (window->ColumnsStorage.Size > 0 && TreeNode("Columns", "Columns sets (%d)", window->ColumnsStorage.Size))
    {
        for (int n = 0; n < window->ColumnsStorage.Size; n++)
            DebugNodeColumns(&window->ColumnsStorage[n]);
        TreePop();
    }
    DebugNodeStorage(&window->StateStorage, "Storage");
    TreePop();
}